

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

UINT8 ym2610_timer_over(void *chip,UINT8 c)

{
  byte bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,c) == 0) {
    ym2610b_update_one(chip,0,(DEV_SMPL **)0x0);
    if ((*(byte *)((long)chip + 0x230) & 4) != 0) {
      bVar1 = *(byte *)((long)chip + 0x22f) | 1;
      *(byte *)((long)chip + 0x22f) = bVar1;
      if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar1) != 0))
      {
        *(undefined1 *)((long)chip + 0x22d) = 1;
        if (*(code **)((long)chip + 0x650) != (code *)0x0) {
          (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
        }
      }
    }
    iVar2 = 0x400 - *(int *)((long)chip + 0x238);
    *(int *)((long)chip + 0x23c) = iVar2;
    if (*(code **)((long)chip + 0x648) != (code *)0x0) {
      (**(code **)((long)chip + 0x648))
                (*(undefined8 *)((long)chip + 0x210),0,iVar2 * *(int *)((long)chip + 0x228),
                 *(undefined4 *)((long)chip + 0x218));
      iVar2 = *(int *)((long)chip + 0x23c);
    }
    *(int *)((long)chip + 0x23c) = iVar2 << 0xc;
    if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
      CSMKeyControl((FM_OPN *)((long)chip + 0x208),(FM_CH *)((long)chip + 0x4aa8));
    }
  }
  else {
    if ((*(byte *)((long)chip + 0x230) & 8) != 0) {
      bVar1 = *(byte *)((long)chip + 0x22f) | 2;
      *(byte *)((long)chip + 0x22f) = bVar1;
      if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar1) != 0))
      {
        *(undefined1 *)((long)chip + 0x22d) = 1;
        if (*(code **)((long)chip + 0x650) != (code *)0x0) {
          (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
        }
      }
    }
    iVar2 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
    *(int *)((long)chip + 0x244) = iVar2;
    if (*(code **)((long)chip + 0x648) != (code *)0x0) {
      (**(code **)((long)chip + 0x648))
                (*(undefined8 *)((long)chip + 0x210),1,iVar2 * *(int *)((long)chip + 0x228),
                 *(undefined4 *)((long)chip + 0x218));
      iVar2 = *(int *)((long)chip + 0x244);
    }
    *(int *)((long)chip + 0x244) = iVar2 << 0xc;
  }
  return *(UINT8 *)((long)chip + 0x22d);
}

Assistant:

UINT8 ym2610_timer_over(void *chip,UINT8 c)
{
	YM2610 *F2610 = (YM2610 *)chip;

	if( c )
	{   /* Timer B */
		TimerBOver( &(F2610->OPN.ST) );
	}
	else
	{   /* Timer A */
		ym2610_update_req(F2610);
		/* timer update */
		TimerAOver( &(F2610->OPN.ST) );
		/* CSM mode key,TL control */
		if ((F2610->OPN.ST.mode & 0xc0) == 0x80)
		{   /* CSM mode total level latch and auto key on */
			CSMKeyControl( &F2610->OPN, &(F2610->CH[2]) );
		}
	}
	return F2610->OPN.ST.irq;
}